

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.h
# Opt level: O2

size_t chacha20poly1305_decrypt
                 (ptls_aead_context_t *_ctx,void *output,void *input,size_t inlen,uint64_t seq,
                 void *aad,size_t aadlen)

{
  int iVar1;
  _func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *p_Var2;
  uint8_t tag [16];
  
  if (inlen < 0x10) {
    p_Var2 = (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)0xffffffffffffffff;
  }
  else {
    chacha20poly1305_init(_ctx,seq,aad,aadlen);
    p_Var2 = (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)(inlen - 0x10);
    (*_ctx[1].do_encrypt_final)(_ctx,input);
    _ctx[1].do_encrypt_init = p_Var2;
    chacha20poly1305_finalize((chacha20poly1305_context_t *)_ctx,tag);
    iVar1 = (*ptls_mem_equal)(tag,(void *)((long)input + (inlen - 0x10)),0x10);
    if (iVar1 == 0) {
      p_Var2 = (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)0xffffffffffffffff;
    }
    else {
      (*(code *)(_ctx[1].algo)->ctr_cipher)(_ctx[1].algo,output,input,p_Var2);
    }
    (*ptls_clear_memory)(tag,0x10);
  }
  return (size_t)p_Var2;
}

Assistant:

static size_t chacha20poly1305_decrypt(ptls_aead_context_t *_ctx, void *output, const void *input, size_t inlen, uint64_t seq,
                                       const void *aad, size_t aadlen)
{
    struct chacha20poly1305_context_t *ctx = (struct chacha20poly1305_context_t *)_ctx;
    uint8_t tag[PTLS_CHACHA20POLY1305_TAG_SIZE];
    size_t ret;

    if (inlen < sizeof(tag))
        return SIZE_MAX;

    chacha20poly1305_init(&ctx->super, seq, aad, aadlen);

    ctx->poly1305_update(ctx, input, inlen - sizeof(tag));
    ctx->textlen = inlen - sizeof(tag);

    chacha20poly1305_finalize(ctx, tag);
    if (ptls_mem_equal(tag, (const uint8_t *)input + inlen - sizeof(tag), sizeof(tag))) {
        ptls_cipher_encrypt(ctx->chacha, output, input, inlen - sizeof(tag));
        ret = inlen - sizeof(tag);
    } else {
        ret = SIZE_MAX;
    }

    ptls_clear_memory(tag, sizeof(tag));

    return ret;
}